

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O3

void pzshape::TPZShapeDisc::Shape
               (int *dimension,int *degree,TPZVec<double> *X,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi,MShapeType type)

{
  TPZManVector<double,_3> X0;
  double local_68;
  TPZManVector<double,_3> local_60;
  
  local_68 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&local_60,3,&local_68);
  if (type < ETensorialFull) {
    Shape2D(1.0,&local_60.super_TPZVec<double>,X,*degree,phi,dphi,type);
    TPZManVector<double,_3>::~TPZManVector(&local_60);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not implement",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeDisc.cpp"
             ,0xfd);
}

Assistant:

void TPZShapeDisc::Shape(int &dimension,int &degree,TPZVec<REAL> &X, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi,MShapeType type)
		{
				REAL C=1;//fator de escala utilizado neste metodo
				TPZManVector<REAL,3> X0(3,0.);//centro do elemento
				
				if(type == ETensorial ||type == EOrdemTotal){
						TPZShapeDisc::Shape2D(C,X0,X,degree,phi,dphi,type);
				}
				else {
						std::cout<<"Not implement"<<std::endl;
						DebugStop();
				}
				
				
				
		}